

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_plan_generator.hpp
# Opt level: O3

PhysicalOperator * __thiscall
duckdb::PhysicalPlan::
Make<duckdb::PhysicalTableScan,duckdb::vector<duckdb::LogicalType,true>&,duckdb::TableFunction&,duckdb::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>,duckdb::vector<duckdb::LogicalType,true>&,duckdb::vector<duckdb::ColumnIndex,true>&,duckdb::vector<unsigned_long,true>,duckdb::vector<std::__cxx11::string,true>&,duckdb::unique_ptr<duckdb::TableFilterSet,std::default_delete<duckdb::TableFilterSet>,true>,unsigned_long&,duckdb::ExtraOperatorInfo&,duckdb::vector<duckdb::Value,true>,std::unordered_map<unsigned_long,duckdb::TableColumn,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::TableColumn>>>>
          (PhysicalPlan *this,vector<duckdb::LogicalType,_true> *args,TableFunction *args_1,
          unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *args_2,
          vector<duckdb::LogicalType,_true> *args_3,vector<duckdb::ColumnIndex,_true> *args_4,
          vector<unsigned_long,_true> *args_5,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *args_6,unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
                  *args_7,unsigned_long *args_8,ExtraOperatorInfo *args_9,
          vector<duckdb::Value,_true> *args_10,
          unordered_map<unsigned_long,_duckdb::TableColumn,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>_>
          *args_11)

{
  pointer *pprVar1;
  idx_t estimated_cardinality;
  iterator __position;
  _Head_base<0UL,_duckdb::TableFilterSet_*,_false> _Var2;
  PhysicalTableScan *pPVar3;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_318;
  _Head_base<0UL,_duckdb::TableFilterSet_*,_false> local_310;
  PhysicalTableScan *local_308;
  __alloc_node_gen_t __alloc_node_gen;
  vector<unsigned_long,_true> local_2f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_2d8;
  vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> local_2c0;
  vector<duckdb::LogicalType,_true> local_2a8;
  vector<duckdb::LogicalType,_true> local_290;
  vector<duckdb::Value,_true> local_278;
  ExtraOperatorInfo local_258;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_220;
  undefined1 local_1e8 [144];
  __buckets_ptr local_158;
  size_type local_150;
  __node_base local_148;
  size_type local_140;
  _Prime_rehash_policy local_138;
  __node_base_ptr local_128;
  undefined1 auStack_120 [216];
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  TableFunctionInitialization local_38;
  
  pPVar3 = (PhysicalTableScan *)ArenaAllocator::AllocateAligned(&this->arena,0x340);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_290,
             &args->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  SimpleFunction::SimpleFunction((SimpleFunction *)local_1e8,(SimpleFunction *)args_1);
  local_1e8._0_8_ = &PTR__SimpleNamedParameterFunction_02439fb8;
  __alloc_node_gen._M_h = (__hashtable_alloc *)&local_158;
  local_158 = (__buckets_ptr)0x0;
  local_150 = (args_1->super_SimpleNamedParameterFunction).named_parameters._M_h._M_bucket_count;
  local_148._M_nxt = (_Hash_node_base *)0x0;
  local_140 = (args_1->super_SimpleNamedParameterFunction).named_parameters._M_h._M_element_count;
  local_138._M_max_load_factor =
       (args_1->super_SimpleNamedParameterFunction).named_parameters._M_h._M_rehash_policy.
       _M_max_load_factor;
  local_138._4_4_ =
       *(undefined4 *)
        &(args_1->super_SimpleNamedParameterFunction).named_parameters._M_h._M_rehash_policy.
         field_0x4;
  local_138._M_next_resize =
       (args_1->super_SimpleNamedParameterFunction).named_parameters._M_h._M_rehash_policy.
       _M_next_resize;
  local_128 = (__node_base_ptr)0x0;
  local_308 = pPVar3;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::LogicalType>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)__alloc_node_gen._M_h,
             &(args_1->super_SimpleNamedParameterFunction).named_parameters._M_h,&__alloc_node_gen);
  local_1e8._0_8_ = &PTR__TableFunction_02439e90;
  switchD_015df945::default(auStack_120,&args_1->bind,0xd6);
  local_48 = (args_1->function_info).internal.
             super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_40._M_pi =
       (args_1->function_info).internal.
       super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_40._M_pi)->_M_use_count = (local_40._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_40._M_pi)->_M_use_count = (local_40._M_pi)->_M_use_count + 1;
    }
  }
  local_38 = args_1->global_initialization;
  local_318._M_head_impl =
       (args_2->super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>).
       _M_t.super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
       super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
  (args_2->super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)._M_t.
  super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
  super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl = (FunctionData *)0x0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_2a8,
             &args_3->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::vector
            (&local_2c0,
             &args_4->super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>);
  local_2f0.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (args_5->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_2f0.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (args_5->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_2f0.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (args_5->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (args_5->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (args_5->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (args_5->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_2d8,
           &args_6->
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          );
  local_310._M_head_impl =
       (args_7->
       super_unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>)._M_t.
       super___uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>
       .super__Head_base<0UL,_duckdb::TableFilterSet_*,_false>._M_head_impl;
  (args_7->super_unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>).
  _M_t.super___uniq_ptr_impl<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>.
  super__Head_base<0UL,_duckdb::TableFilterSet_*,_false>._M_head_impl = (TableFilterSet *)0x0;
  estimated_cardinality = *args_8;
  ExtraOperatorInfo::ExtraOperatorInfo(&local_258,args_9);
  local_278.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (args_10->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_278.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (args_10->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_278.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (args_10->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
       super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (args_10->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (args_10->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (args_10->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&local_220,args_11);
  PhysicalTableScan::PhysicalTableScan
            (local_308,&local_290,(TableFunction *)local_1e8,
             (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             &local_318,&local_2a8,(vector<duckdb::ColumnIndex,_true> *)&local_2c0,&local_2f0,
             &local_2d8,
             (unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
              *)&local_310,estimated_cardinality,&local_258,&local_278,
             (virtual_column_map_t *)&local_220);
  ::std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_220);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_278);
  if (local_258.sample_options.
      super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
      super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
      super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true,_true>
       )0x0) {
    Value::~Value((Value *)local_258.sample_options.
                           super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>
                           ._M_t.
                           super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>
                           .super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl);
    operator_delete((void *)local_258.sample_options.
                            super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>
                            .super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl);
  }
  local_258.sample_options.
  super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
  super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
  super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl =
       (unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>)
       (__uniq_ptr_data<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true,_true>
        )0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.file_filters._M_dataplus._M_p != &local_258.file_filters.field_2) {
    operator_delete(local_258.file_filters._M_dataplus._M_p);
  }
  _Var2._M_head_impl = local_310._M_head_impl;
  if ((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
       *)local_310._M_head_impl !=
      (_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
       *)0x0) {
    ::std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
                 *)local_310._M_head_impl);
    operator_delete(_Var2._M_head_impl);
  }
  local_310._M_head_impl = (TableFilterSet *)0x0;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2d8);
  if (local_2f0.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f0.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector(&local_2c0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_2a8);
  if (local_318._M_head_impl != (FunctionData *)0x0) {
    (*(local_318._M_head_impl)->_vptr_FunctionData[1])();
  }
  local_318._M_head_impl = (FunctionData *)0x0;
  local_1e8._0_8_ = &PTR__TableFunction_02439e90;
  if (local_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40._M_pi);
  }
  SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            ((SimpleNamedParameterFunction *)local_1e8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_290);
  pPVar3 = local_308;
  __alloc_node_gen._M_h = (__hashtable_alloc *)local_308;
  __position._M_current =
       (this->ops).
       super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
       .
       super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->ops).
      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    ::std::
    vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
    ::_M_realloc_insert<std::reference_wrapper<duckdb::PhysicalOperator>>
              ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                *)&this->ops,__position,
               (reference_wrapper<duckdb::PhysicalOperator> *)&__alloc_node_gen);
  }
  else {
    (__position._M_current)->_M_data = &local_308->super_PhysicalOperator;
    pprVar1 = &(this->ops).
               super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pprVar1 = *pprVar1 + 1;
  }
  return &pPVar3->super_PhysicalOperator;
}

Assistant:

PhysicalOperator &Make(ARGS &&... args) {
		static_assert(std::is_base_of<PhysicalOperator, T>::value, "T must be a physical operator");
		auto mem = arena.AllocateAligned(sizeof(T));
		auto ptr = new (mem) T(std::forward<ARGS>(args)...);
		ops.push_back(*ptr);
		return *ptr;
	}